

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int experimental_hooks_prof_backtrace_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  ulong uVar1;
  size_t __n;
  prof_backtrace_hook_t local_20;
  
  if (oldp == (void *)0x0 && newp == (void *)0x0) {
    return 0x16;
  }
  if ((oldp != (void *)0x0) &&
     (local_20 = duckdb_je_prof_backtrace_hook_get(), oldlenp != (size_t *)0x0)) {
    uVar1 = *oldlenp;
    if (uVar1 != 8) {
      __n = 8;
      if (uVar1 < 8) {
        __n = uVar1;
      }
      switchD_00b1422a::default(oldp,&local_20,__n);
      *oldlenp = __n;
      return 0x16;
    }
    *(prof_backtrace_hook_t *)oldp = local_20;
  }
  if (newp == (void *)0x0) {
    return 0;
  }
  if (duckdb_je_opt_prof != true) {
    return 2;
  }
  if (newlen != 8) {
    return 0x16;
  }
  if (*newp != (prof_backtrace_hook_t)0x0) {
    duckdb_je_prof_backtrace_hook_set(*newp);
    return 0;
  }
  return 0x16;
}

Assistant:

static int
experimental_hooks_prof_backtrace_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;

	if (oldp == NULL && newp == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	if (oldp != NULL) {
		prof_backtrace_hook_t old_hook =
		    prof_backtrace_hook_get();
		READ(old_hook, prof_backtrace_hook_t);
	}
	if (newp != NULL) {
		if (!opt_prof) {
			ret = ENOENT;
			goto label_return;
		}
		prof_backtrace_hook_t new_hook JEMALLOC_CC_SILENCE_INIT(NULL);
		WRITE(new_hook, prof_backtrace_hook_t);
		if (new_hook == NULL) {
			ret = EINVAL;
			goto label_return;
		}
		prof_backtrace_hook_set(new_hook);
	}
	ret = 0;
label_return:
	return ret;
}